

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::read_texture
          (HL1MDLLoader *this,Texture_HL1 *ptexture,uint8_t *data,uint8_t *pal,aiTexture *pResult,
          aiColor3D *last_palette_color)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  aiTexel *paVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  float fVar14;
  int col2 [256];
  int col1 [256];
  int row2 [256];
  int row1 [256];
  
  uVar11 = 1;
  do {
    uVar12 = uVar11;
    uVar11 = uVar12 * 2;
  } while ((int)uVar12 < ptexture->width);
  uVar11 = 1;
  do {
    uVar9 = uVar11;
    uVar11 = uVar9 * 2;
  } while ((int)uVar9 < ptexture->height);
  if (0xff < (int)uVar12) {
    uVar12 = 0x100;
  }
  uVar11 = 0x100;
  if ((int)uVar9 < 0x100) {
    uVar11 = uVar9;
  }
  aiString::Set(&pResult->mFilename,ptexture->name);
  pResult->mWidth = uVar12;
  pResult->mHeight = uVar11;
  builtin_strncpy(pResult->achFormatHint,"bgra8888",9);
  uVar13 = 0xffffffffffffffff;
  if (-1 < (int)(uVar11 * uVar12)) {
    uVar13 = (long)(int)(uVar11 * uVar12) * 4;
  }
  paVar6 = (aiTexel *)operator_new__(uVar13);
  pResult->pcData = paVar6;
  uVar7 = 0;
  uVar13 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar13 = uVar7;
  }
  for (; uVar13 != uVar7; uVar7 = uVar7 + 1) {
    fVar14 = (float)ptexture->width / (float)(int)uVar12;
    col1[uVar7] = (int)(((float)(int)uVar7 + 0.25) * fVar14);
    col2[uVar7] = (int)(((float)(int)uVar7 + 0.75) * fVar14);
  }
  uVar8 = 0;
  uVar7 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
    fVar14 = (float)ptexture->height / (float)(int)uVar11;
    iVar1 = ptexture->width;
    row1[uVar8] = (int)(((float)(int)uVar8 + 0.25) * fVar14) * iVar1;
    row2[uVar8] = (int)(((float)(int)uVar8 + 0.75) * fVar14) * iVar1;
  }
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (lVar10 = 0; uVar13 * 4 != lVar10; lVar10 = lVar10 + 4) {
      lVar2 = (ulong)data[*(int *)((long)col1 + lVar10) + row1[uVar8]] * 3;
      lVar3 = (ulong)data[row1[uVar8] + *(int *)((long)col2 + lVar10)] * 3;
      lVar4 = (ulong)data[*(int *)((long)col1 + lVar10) + row2[uVar8]] * 3;
      lVar5 = (ulong)data[row2[uVar8] + *(int *)((long)col2 + lVar10)] * 3;
      (&paVar6->r)[lVar10] =
           (uchar)((uint)pal[lVar5] + (uint)pal[lVar4] + (uint)pal[lVar3] + (uint)pal[lVar2] >> 2);
      (&paVar6->g)[lVar10] =
           (uchar)((uint)pal[lVar5 + 1] + (uint)pal[lVar4 + 1] +
                   (uint)pal[lVar3 + 1] + (uint)pal[lVar2 + 1] >> 2);
      (&paVar6->b)[lVar10] =
           (uchar)((uint)pal[lVar5 + 2] + (uint)pal[lVar4 + 2] +
                   (uint)pal[lVar3 + 2] + (uint)pal[lVar2 + 2] >> 2);
      (&paVar6->a)[lVar10] = 0xff;
    }
    paVar6 = (aiTexel *)(&paVar6->b + lVar10);
  }
  last_palette_color->r = (float)pal[0x2fd];
  last_palette_color->g = (float)pal[0x2fe];
  last_palette_color->b = (float)pal[0x2ff];
  return;
}

Assistant:

void HL1MDLLoader::read_texture(const Texture_HL1 *ptexture,
        uint8_t *data, uint8_t *pal, aiTexture *pResult,
        aiColor3D &last_palette_color) {
    int outwidth, outheight;
    int i, j;
    int row1[256], row2[256], col1[256], col2[256];
    unsigned char *pix1, *pix2, *pix3, *pix4;

    // convert texture to power of 2
    for (outwidth = 1; outwidth < ptexture->width; outwidth <<= 1)
        ;

    if (outwidth > 256)
        outwidth = 256;

    for (outheight = 1; outheight < ptexture->height; outheight <<= 1)
        ;

    if (outheight > 256)
        outheight = 256;

    pResult->mFilename = ptexture->name;
    pResult->mWidth = outwidth;
    pResult->mHeight = outheight;
    pResult->achFormatHint[0] = 'b';
    pResult->achFormatHint[1] = 'g';
    pResult->achFormatHint[2] = 'r';
    pResult->achFormatHint[3] = 'a';
    pResult->achFormatHint[4] = '8';
    pResult->achFormatHint[5] = '8';
    pResult->achFormatHint[6] = '8';
    pResult->achFormatHint[7] = '8';
    pResult->achFormatHint[8] = '\0';

    aiTexel *out = pResult->pcData = new aiTexel[outwidth * outheight];

    for (i = 0; i < outwidth; i++) {
        col1[i] = (int)((i + 0.25) * (ptexture->width / (float)outwidth));
        col2[i] = (int)((i + 0.75) * (ptexture->width / (float)outwidth));
    }

    for (i = 0; i < outheight; i++) {
        row1[i] = (int)((i + 0.25) * (ptexture->height / (float)outheight)) * ptexture->width;
        row2[i] = (int)((i + 0.75) * (ptexture->height / (float)outheight)) * ptexture->width;
    }

    // scale down and convert to 32bit RGB
    for (i = 0; i < outheight; i++) {
        for (j = 0; j < outwidth; j++, out++) {
            pix1 = &pal[data[row1[i] + col1[j]] * 3];
            pix2 = &pal[data[row1[i] + col2[j]] * 3];
            pix3 = &pal[data[row2[i] + col1[j]] * 3];
            pix4 = &pal[data[row2[i] + col2[j]] * 3];

            out->r = (pix1[0] + pix2[0] + pix3[0] + pix4[0]) >> 2;
            out->g = (pix1[1] + pix2[1] + pix3[1] + pix4[1]) >> 2;
            out->b = (pix1[2] + pix2[2] + pix3[2] + pix4[2]) >> 2;
            out->a = 0xFF;
        }
    }

    // Get the last palette color.
    last_palette_color.r = pal[255 * 3];
    last_palette_color.g = pal[255 * 3 + 1];
    last_palette_color.b = pal[255 * 3 + 2];
}